

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jishmo.c
# Opt level: O0

int open_codec_context(AVFormatContext *fmt_ctx,AVMediaType type)

{
  FILE *pFVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uStack_40;
  int stream_idx;
  AVDictionary *opts;
  AVCodec *dec;
  AVCodecContext *dec_ctx;
  AVStream *st;
  int ret;
  AVMediaType type_local;
  AVFormatContext *fmt_ctx_local;
  
  dec = (AVCodec *)0x0;
  opts = (AVDictionary *)0x0;
  uStack_40 = 0;
  st._4_4_ = type;
  _ret = fmt_ctx;
  iVar2 = av_find_best_stream(fmt_ctx,type,0xffffffff,0xffffffff,&opts,0);
  pFVar1 = _stderr;
  st._0_4_ = iVar2;
  if (iVar2 < 0) {
    uVar3 = av_get_media_type_string(st._4_4_);
    fprintf(pFVar1,"Could not find %s stream in input file \'%s\'\n",uVar3,src_filename);
    fmt_ctx_local._4_4_ = (int)st;
  }
  else {
    dec_ctx = (AVCodecContext *)_ret->streams[iVar2];
    dec = (AVCodec *)avcodec_alloc_context3(opts);
    if (dec == (AVCodec *)0x0) {
      fprintf(_stderr,"Failed to allocate codec\n");
      fmt_ctx_local._4_4_ = -0x16;
    }
    else {
      uVar3._0_4_ = dec_ctx->dark_masking;
      uVar3._4_4_ = dec_ctx->slice_count;
      st._0_4_ = avcodec_parameters_to_context(dec,uVar3);
      if ((int)st < 0) {
        fprintf(_stderr,"Failed to copy codec parameters to codec context\n");
        fmt_ctx_local._4_4_ = (int)st;
      }
      else {
        av_dict_set(&stack0xffffffffffffffc0,"flags2","+export_mvs",0);
        st._0_4_ = avcodec_open2(dec,opts,&stack0xffffffffffffffc0);
        pFVar1 = _stderr;
        if ((int)st < 0) {
          uVar3 = av_get_media_type_string(st._4_4_);
          fprintf(pFVar1,"Failed to open %s codec\n",uVar3);
          fmt_ctx_local._4_4_ = (int)st;
        }
        else {
          video_stream = _ret->streams[iVar2];
          video_dec_ctx = (AVCodecContext *)dec;
          fmt_ctx_local._4_4_ = 0;
          video_stream_idx = iVar2;
        }
      }
    }
  }
  return fmt_ctx_local._4_4_;
}

Assistant:

static int open_codec_context(AVFormatContext *fmt_ctx, enum AVMediaType type)
{
    int ret;
    AVStream *st;
    AVCodecContext *dec_ctx = NULL;
    AVCodec *dec = NULL;
    AVDictionary *opts = NULL;

    ret = av_find_best_stream(fmt_ctx, type, -1, -1, &dec, 0);
    if (ret < 0) {
        fprintf(stderr, "Could not find %s stream in input file '%s'\n",
                av_get_media_type_string(type), src_filename);
        return ret;
    } else {
        int stream_idx = ret;
        st = fmt_ctx->streams[stream_idx];

        dec_ctx = avcodec_alloc_context3(dec);
        if (!dec_ctx) {
            fprintf(stderr, "Failed to allocate codec\n");
            return AVERROR(EINVAL);
        }

        ret = avcodec_parameters_to_context(dec_ctx, st->codecpar);
        if (ret < 0) {
            fprintf(stderr, "Failed to copy codec parameters to codec context\n");
            return ret;
        }

        /* Init the video decoder */
        av_dict_set(&opts, "flags2", "+export_mvs", 0);
        if ((ret = avcodec_open2(dec_ctx, dec, &opts)) < 0) {
            fprintf(stderr, "Failed to open %s codec\n",
                    av_get_media_type_string(type));
            return ret;
        }

        video_stream_idx = stream_idx;
        video_stream = fmt_ctx->streams[video_stream_idx];
        video_dec_ctx = dec_ctx;
    }

    return 0;
}